

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

void __thiscall inja::Parser::parse_into(Parser *this,Template *tmpl,string_view path)

{
  Token *this_00;
  Token *pTVar1;
  Kind KVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_type sVar6;
  const_pointer pcVar7;
  string_view path_00;
  string_view path_01;
  bool bVar8;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  size_type *psVar12;
  Lexer *this_01;
  string local_d0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  const_pointer local_50;
  size_type local_48;
  Lexer *local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  
  local_48 = path.size_;
  local_50 = path.data_;
  local_40 = &this->m_lexer;
  sVar6 = (tmpl->content)._M_string_length;
  (this->m_lexer).m_in.data_ = (tmpl->content)._M_dataplus._M_p;
  (this->m_lexer).m_in.size_ = sVar6;
  (this->m_lexer).m_state = Text;
  (this->m_lexer).m_tok_start = 0;
  (this->m_lexer).m_pos = 0;
  this_00 = &this->m_tok;
  pTVar1 = &this->m_peek_tok;
  local_38 = &(this->m_tok).text;
  this_01 = local_40;
LAB_00186b77:
  if (this->m_have_peek_tok == true) {
    (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
    uVar3 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
    uVar4 = *(undefined4 *)&(this->m_peek_tok).text.data_;
    uVar5 = *(undefined4 *)((long)&(this->m_peek_tok).text.data_ + 4);
    this_00->kind = pTVar1->kind;
    *(undefined4 *)&(this->m_tok).field_0x4 = uVar3;
    *(undefined4 *)&(this->m_tok).text.data_ = uVar4;
    *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = uVar5;
    this->m_have_peek_tok = false;
  }
  else {
    Lexer::scan((Token *)&local_d0,this_01);
    (this->m_tok).text.size_ = local_d0.field_2._M_allocated_capacity;
    this_00->kind = (Kind)local_d0._M_dataplus._M_p;
    *(undefined4 *)&(this->m_tok).field_0x4 = local_d0._M_dataplus._M_p._4_4_;
    *(undefined4 *)&(this->m_tok).text.data_ = (undefined4)local_d0._M_string_length;
    *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = local_d0._M_string_length._4_4_;
  }
  switch(this_00->kind) {
  case Text:
    local_b0._M_dataplus._M_p._0_1_ = 1;
    local_d0._M_dataplus._M_p = local_d0._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
    emplace_back<inja::Bytecode::Op,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&,unsigned_int>
              ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)tmpl,(Op *)&local_b0,
               local_38,(uint *)&local_d0);
    goto LAB_00186b77;
  case ExpressionOpen:
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
      uVar3 = *(undefined4 *)&pTVar1->field_0x4;
      pcVar7 = (this->m_peek_tok).text.data_;
      this_00->kind = pTVar1->kind;
      *(undefined4 *)&this_00->field_0x4 = uVar3;
      (this->m_tok).text.data_ = pcVar7;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d0,this_01);
      (this->m_tok).text.size_ = local_d0.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d0._M_dataplus._M_p;
      (this->m_tok).text.data_ =
           (const_pointer)
           CONCAT44(local_d0._M_string_length._4_4_,(undefined4)local_d0._M_string_length);
    }
    bVar8 = parse_expression(this,tmpl);
    if (!bVar8) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parser_error","");
      Token::describe_abi_cxx11_(&local_70,this_00);
      puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3ffeeb)
      ;
      local_90 = &local_80;
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_80 = *plVar9;
        lStack_78 = puVar10[3];
      }
      else {
        local_80 = *plVar9;
        local_90 = (long *)*puVar10;
      }
      local_88 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0.field_2._8_8_ = puVar10[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_b0._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      inja_throw(&local_d0,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    append_function(this,tmpl,PrintValue,1);
    this_01 = local_40;
    if ((this->m_tok).kind != ExpressionClose) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parser_error","");
      Token::describe_abi_cxx11_(&local_70,this_00);
      puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3fff06)
      ;
      local_90 = &local_80;
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_80 = *plVar9;
        lStack_78 = puVar10[3];
      }
      else {
        local_80 = *plVar9;
        local_90 = (long *)*puVar10;
      }
      local_88 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0.field_2._8_8_ = puVar10[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_b0._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      inja_throw(&local_d0,&local_b0);
      break;
    }
    goto LAB_00186b77;
  case ExpressionClose:
  case LineStatementClose:
  case StatementClose:
    goto switchD_00186bd0_caseD_2;
  case LineStatementOpen:
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
      uVar3 = *(undefined4 *)&pTVar1->field_0x4;
      pcVar7 = (this->m_peek_tok).text.data_;
      this_00->kind = pTVar1->kind;
      *(undefined4 *)&this_00->field_0x4 = uVar3;
      (this->m_tok).text.data_ = pcVar7;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d0,this_01);
      (this->m_tok).text.size_ = local_d0.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d0._M_dataplus._M_p;
      (this->m_tok).text.data_ =
           (const_pointer)
           CONCAT44(local_d0._M_string_length._4_4_,(undefined4)local_d0._M_string_length);
    }
    path_01.size_ = local_48;
    path_01.data_ = local_50;
    parse_statement(this,tmpl,path_01);
    KVar2 = (this->m_tok).kind;
    if ((KVar2 == LineStatementClose) || (KVar2 == Eof)) goto LAB_00186b77;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parser_error","");
    Token::describe_abi_cxx11_(&local_70,this_00);
    puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3ffec6);
    local_90 = &local_80;
    plVar9 = puVar10 + 2;
    if ((long *)*puVar10 == plVar9) {
      local_80 = *plVar9;
      lStack_78 = puVar10[3];
    }
    else {
      local_80 = *plVar9;
      local_90 = (long *)*puVar10;
    }
    local_88 = puVar10[1];
    *puVar10 = plVar9;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0.field_2._8_8_ = puVar10[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_b0._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    inja_throw(&local_d0,&local_b0);
    break;
  case StatementOpen:
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
      uVar3 = *(undefined4 *)&pTVar1->field_0x4;
      pcVar7 = (this->m_peek_tok).text.data_;
      this_00->kind = pTVar1->kind;
      *(undefined4 *)&this_00->field_0x4 = uVar3;
      (this->m_tok).text.data_ = pcVar7;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d0,this_01);
      (this->m_tok).text.size_ = local_d0.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d0._M_dataplus._M_p;
      (this->m_tok).text.data_ =
           (const_pointer)
           CONCAT44(local_d0._M_string_length._4_4_,(undefined4)local_d0._M_string_length);
    }
    path_00.size_ = local_48;
    path_00.data_ = local_50;
    bVar8 = parse_statement(this,tmpl,path_00);
    if (!bVar8) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parser_error","");
      Token::describe_abi_cxx11_(&local_70,this_00);
      puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3ffe8c)
      ;
      local_90 = &local_80;
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_80 = *plVar9;
        lStack_78 = puVar10[3];
      }
      else {
        local_80 = *plVar9;
        local_90 = (long *)*puVar10;
      }
      local_88 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0.field_2._8_8_ = puVar10[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_b0._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      inja_throw(&local_d0,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    if (this_00->kind == StatementClose) goto LAB_00186b77;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parser_error","");
    Token::describe_abi_cxx11_(&local_70,this_00);
    puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3ffea6);
    local_90 = &local_80;
    plVar9 = puVar10 + 2;
    if ((long *)*puVar10 == plVar9) {
      local_80 = *plVar9;
      lStack_78 = puVar10[3];
    }
    else {
      local_80 = *plVar9;
      local_90 = (long *)*puVar10;
    }
    local_88 = puVar10[1];
    *puVar10 = plVar9;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0.field_2._8_8_ = puVar10[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_b0._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    inja_throw(&local_d0,&local_b0);
    break;
  case CommentOpen:
    goto switchD_00186bd0_caseD_7;
  default:
    if (this_00->kind == Eof) {
      if ((this->m_if_stack).
          super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->m_if_stack).
          super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parser_error","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"unmatched if","");
        inja_throw(&local_d0,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      if ((this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parser_error","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"unmatched for","");
        inja_throw(&local_d0,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      return;
    }
switchD_00186bd0_caseD_2:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parser_error","");
    Token::describe_abi_cxx11_(&local_70,this_00);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3fff45);
    local_90 = &local_80;
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_80 = *plVar11;
      lStack_78 = plVar9[3];
    }
    else {
      local_80 = *plVar11;
      local_90 = (long *)*plVar9;
    }
    local_88 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0.field_2._8_8_ = plVar9[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_b0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    inja_throw(&local_d0,&local_b0);
  }
  goto LAB_00187573;
switchD_00186bd0_caseD_7:
  if (this->m_have_peek_tok == true) {
    (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
    uVar3 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
    uVar4 = *(undefined4 *)&(this->m_peek_tok).text.data_;
    uVar5 = *(undefined4 *)((long)&(this->m_peek_tok).text.data_ + 4);
    this_00->kind = pTVar1->kind;
    *(undefined4 *)&(this->m_tok).field_0x4 = uVar3;
    *(undefined4 *)&(this->m_tok).text.data_ = uVar4;
    *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = uVar5;
    this->m_have_peek_tok = false;
  }
  else {
    Lexer::scan((Token *)&local_d0,this_01);
    (this->m_tok).text.size_ = local_d0.field_2._M_allocated_capacity;
    this_00->kind = (Kind)local_d0._M_dataplus._M_p;
    *(undefined4 *)&(this->m_tok).field_0x4 = local_d0._M_dataplus._M_p._4_4_;
    *(undefined4 *)&(this->m_tok).text.data_ = (undefined4)local_d0._M_string_length;
    *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = local_d0._M_string_length._4_4_;
  }
  if (this_00->kind == CommentClose) goto LAB_00186b77;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parser_error","");
  Token::describe_abi_cxx11_(&local_70,this_00);
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3fff27);
  local_90 = &local_80;
  plVar9 = puVar10 + 2;
  if ((long *)*puVar10 == plVar9) {
    local_80 = *plVar9;
    lStack_78 = puVar10[3];
  }
  else {
    local_80 = *plVar9;
    local_90 = (long *)*puVar10;
  }
  local_88 = puVar10[1];
  *puVar10 = plVar9;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_b0.field_2._M_allocated_capacity = *psVar12;
    local_b0.field_2._8_8_ = puVar10[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar12;
    local_b0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_b0._M_string_length = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  inja_throw(&local_d0,&local_b0);
LAB_00187573:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  goto LAB_00186b77;
}

Assistant:

void parse_into(Template& tmpl, nonstd::string_view path) {
		m_lexer.start(tmpl.content);

		for (;;) {
			get_next_token();
			switch (m_tok.kind) {
				case Token::Kind::Eof:
					if (!m_if_stack.empty()) inja_throw("parser_error", "unmatched if");
					if (!m_loop_stack.empty()) inja_throw("parser_error", "unmatched for");
					return;
				case Token::Kind::Text:
					tmpl.bytecodes.emplace_back(Bytecode::Op::PrintText, m_tok.text, 0u);
					break;
				case Token::Kind::StatementOpen:
					get_next_token();
					if (!parse_statement(tmpl, path)) {
						inja_throw("parser_error", "expected statement, got '" + m_tok.describe() + "'");
					}
					if (m_tok.kind != Token::Kind::StatementClose) {
						inja_throw("parser_error", "expected statement close, got '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::LineStatementOpen:
					get_next_token();
					parse_statement(tmpl, path);
					if (m_tok.kind != Token::Kind::LineStatementClose && m_tok.kind != Token::Kind::Eof) {
						inja_throw("parser_error", "expected line statement close, got '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::ExpressionOpen:
					get_next_token();
					if (!parse_expression(tmpl)) {
						inja_throw("parser_error", "expected expression, got '" + m_tok.describe() + "'");
					}
					append_function(tmpl, Bytecode::Op::PrintValue, 1);
					if (m_tok.kind != Token::Kind::ExpressionClose) {
						inja_throw("parser_error", "expected expression close, got '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::CommentOpen:
					get_next_token();
					if (m_tok.kind != Token::Kind::CommentClose) {
						inja_throw("parser_error", "expected comment close, got '" + m_tok.describe() + "'");
					}
					break;
				default:
					inja_throw("parser_error", "unexpected token '" + m_tok.describe() + "'");
					break;
			}
		}
	}